

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O2

int Gia_MiniAigSuperPreprocess(Mini_Aig_t *p,Vec_Wec_t *vSuper,int nPis,int fVerbose)

{
  int iVar1;
  Vec_Int_t *p_00;
  uint uVar2;
  uint i;
  uint uVar3;
  
  uVar2 = 1;
  for (i = 0; (int)i < vSuper->nSize; i = i + 1) {
    p_00 = Vec_WecEntry(vSuper,i);
    qsort(p_00->pArray,(long)p_00->nSize,4,Vec_IntSortCompare1);
    if (fVerbose != 0) {
      printf("\nOutput %d\n",(ulong)i);
      Gia_MiniAigSuperPrintDouble(p_00,nPis);
    }
    uVar3 = 1;
    while( true ) {
      iVar1 = Gia_MiniAigSuperMerge(p_00,nPis);
      if (iVar1 == 0) break;
      if (fVerbose != 0) {
        Gia_MiniAigSuperPrintDouble(p_00,nPis);
      }
      uVar3 = uVar3 + 1;
    }
    if ((int)uVar2 <= (int)uVar3) {
      uVar2 = uVar3;
    }
  }
  if (fVerbose != 0) {
    printf("Multi = %d.\n",(ulong)uVar2);
  }
  return uVar2;
}

Assistant:

int Gia_MiniAigSuperPreprocess( Mini_Aig_t * p, Vec_Wec_t * vSuper, int nPis, int fVerbose )
{
    Vec_Int_t * vRes;
    int i, nIters, Multi = 1;
    Vec_WecForEachLevel( vSuper, vRes, i )
    {
        Vec_IntSort( vRes, 0 );
        if ( fVerbose ) 
            printf( "\nOutput %d\n", i );
        if ( fVerbose )
            Gia_MiniAigSuperPrintDouble( vRes, nPis );
        for ( nIters = 1; Gia_MiniAigSuperMerge(vRes, nPis); nIters++ )
        {
            if ( fVerbose )
                Gia_MiniAigSuperPrintDouble( vRes, nPis );
        }
        Multi = Abc_MaxInt( Multi, nIters );
    }
    if ( fVerbose )
        printf( "Multi = %d.\n", Multi );
    return Multi;
}